

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zigzag_persistence.h
# Opt level: O0

void __thiscall
Gudhi::zigzag_persistence::Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options>::
Zigzag_persistence(Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options> *this,
                  function<void_(int,_int,_int)> *stream_interval,uint preallocationSize)

{
  uint characteristic;
  anon_class_8_1_8991fb9c local_70;
  function<bool_(unsigned_int,_unsigned_int)> local_68;
  anon_class_8_1_8991fb9c local_48;
  function<bool_(unsigned_int,_unsigned_int)> local_40;
  uint local_1c;
  function<void_(int,_int,_int)> *pfStack_18;
  uint preallocationSize_local;
  function<void_(int,_int,_int)> *stream_interval_local;
  Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options> *this_local;
  
  local_48.this = this;
  local_1c = preallocationSize;
  pfStack_18 = stream_interval;
  stream_interval_local = (function<void_(int,_int,_int)> *)this;
  std::function<bool(unsigned_int,unsigned_int)>::
  function<Gudhi::zigzag_persistence::Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options>::Zigzag_persistence(std::function<void(int,int,int)>,unsigned_int)::_lambda(unsigned_int,unsigned_int)_1_,void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_40,&local_48);
  local_70.this = this;
  std::function<bool(unsigned_int,unsigned_int)>::
  function<Gudhi::zigzag_persistence::Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options>::Zigzag_persistence(std::function<void(int,int,int)>,unsigned_int)::_lambda(unsigned_int,unsigned_int)_2_,void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_68,&local_70);
  characteristic =
       persistence_matrix::
       Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>
       ::get_null_value<unsigned_int>();
  persistence_matrix::
  Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>
  ::Matrix(&this->matrix_,preallocationSize,&local_40,&local_68,characteristic);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_68);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_40);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map(&this->births_);
  Birth_ordering::Birth_ordering(&this->birthOrdering_);
  this->numArrow_ = -1;
  std::function<void_(int,_int,_int)>::function(&this->stream_interval_,stream_interval);
  return;
}

Assistant:

Zigzag_persistence(std::function<void(Dimension, Index, Index)> stream_interval,
                     unsigned int preallocationSize = 0)
      : matrix_(
            preallocationSize,
            [this](Matrix_index columnIndex1, Matrix_index columnIndex2) -> bool {
              if (matrix_.get_column(columnIndex1).is_paired()) {
                return matrix_.get_pivot(columnIndex1) < matrix_.get_pivot(columnIndex2);
              }
              return birthOrdering_.birth_order(births_.at(columnIndex1), births_.at(columnIndex2));
            },
            [this](Matrix_index columnIndex1, Matrix_index columnIndex2) -> bool { return false; }),
        numArrow_(-1),
        stream_interval_(std::move(stream_interval)) {}